

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O1

void collect_mv_stats_sb(MV_STATS *mv_stats,AV1_COMP *cpi,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  MB_MODE_INFO **ppMVar8;
  bool bVar9;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  
LAB_001da160:
  if ((cpi->common).mi_params.mi_rows <= mi_row) {
    return;
  }
  if ((cpi->common).mi_params.mi_cols <= mi_col) {
    return;
  }
  iVar15 = (cpi->common).mi_params.mi_rows;
  uVar10 = (ulong)bsize;
  bVar11 = 0xff;
  if (mi_row < iVar15) {
    iVar6 = (cpi->common).mi_params.mi_cols;
    bVar11 = 0xff;
    if (mi_col < iVar6) {
      iVar7 = (cpi->common).mi_params.mi_stride;
      ppMVar8 = (cpi->common).mi_params.mi_grid_base;
      lVar14 = (long)(iVar7 * mi_row + mi_col);
      BVar1 = ppMVar8[lVar14]->bsize;
      if (BVar1 == bsize) {
        bVar11 = 0;
      }
      else {
        bVar5 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar10]
        ;
        bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar10]
        ;
        bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar1];
        bVar4 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar1];
        if (BLOCK_8X8 < bsize) {
          if ((int)((uint)(bVar2 >> 1) + mi_row) < iVar15) {
            if ((int)((uint)(bVar5 >> 1) + mi_col) < iVar6) {
              if (bVar4 == bVar2) {
                bVar11 = 8;
                if ((uint)bVar3 << 2 != (uint)bVar5) {
                  bVar11 = (ppMVar8[lVar14 + (int)((uint)(bVar5 >> 1) * iVar7)]->bsize != BVar1) *
                           '\x04' + 1;
                }
              }
              else if (bVar3 == bVar5) {
                bVar11 = 9;
                if ((uint)bVar4 << 2 != (uint)bVar2) {
                  bVar11 = (ppMVar8[lVar14 + (ulong)(uint)(bVar2 >> 1)]->bsize != BVar1) * '\x05' +
                           2;
                }
              }
              else {
                bVar11 = 3;
                if ((((uint)bVar4 * 2 == (uint)bVar2) && ((uint)bVar3 * 2 == (uint)bVar5)) &&
                   (bVar11 = 4,
                   "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [ppMVar8[lVar14 + (int)((uint)(bVar5 >> 1) * iVar7)]->bsize] != bVar2)) {
                  bVar11 = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [ppMVar8[lVar14 + (ulong)(uint)(bVar2 >> 1)]->bsize] == bVar5) * '\x03'
                           + 3;
                }
              }
              goto LAB_001da280;
            }
          }
        }
        bVar11 = *(byte *)((long)&get_partition_base_partitions +
                          (ulong)(bVar3 < bVar5) + (ulong)(bVar4 < bVar2) * 2);
      }
    }
  }
LAB_001da280:
  BVar1 = BLOCK_INVALID;
  if (bVar11 == 0xff) goto LAB_001da2f4;
  switch(uVar10) {
  case 0:
    bVar9 = false;
    uVar12 = uVar10;
    goto LAB_001da2dc;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_001da29c_caseD_1:
    bVar9 = true;
    uVar12 = 6;
    goto LAB_001da2dc;
  case 3:
    uVar12 = 1;
    break;
  case 6:
    uVar12 = 2;
    break;
  case 9:
    uVar12 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar12 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001da29c_caseD_1;
      uVar12 = 5;
    }
  }
  bVar9 = false;
LAB_001da2dc:
  if (!bVar9) {
    BVar1 = subsize_lookup[bVar11][uVar12];
  }
LAB_001da2f4:
  bsize = BVar1;
  bVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar10];
  uVar13 = (uint)(bVar5 >> 1);
  if (bVar11 == 3) goto code_r0x001da30e;
  switch(bVar11) {
  case 0:
    goto LAB_001da5a9;
  case 1:
    collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
    mi_row = uVar13 + mi_row;
    goto LAB_001da5a9;
  case 2:
    collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
    goto LAB_001da501;
  default:
    return;
  case 4:
    collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
    iVar15 = mi_col;
    break;
  case 5:
    collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
    iVar15 = mi_row + uVar13;
    goto LAB_001da4cf;
  case 6:
    collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
    iVar15 = mi_row;
LAB_001da4cf:
    collect_mv_stats_b(mv_stats,cpi,mi_row + uVar13,mi_col);
    mi_row = iVar15;
LAB_001da501:
    mi_col = uVar13 + mi_col;
    goto LAB_001da5a9;
  case 7:
    collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
    iVar15 = mi_col + uVar13;
    break;
  case 8:
    iVar15 = 4;
    do {
      collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
      mi_row = mi_row + (uint)(bVar5 >> 2);
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    return;
  case 9:
    iVar15 = 4;
    do {
      collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
      mi_col = mi_col + (uint)(bVar5 >> 2);
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    return;
  }
  collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col + uVar13);
  mi_row = uVar13 + mi_row;
  mi_col = iVar15;
LAB_001da5a9:
  collect_mv_stats_b(mv_stats,cpi,mi_row,mi_col);
  return;
code_r0x001da30e:
  collect_mv_stats_sb(mv_stats,cpi,mi_row,mi_col,bsize);
  collect_mv_stats_sb(mv_stats,cpi,mi_row,mi_col + uVar13,bsize);
  mi_row = uVar13 + mi_row;
  collect_mv_stats_sb(mv_stats,cpi,mi_row,mi_col,bsize);
  mi_col = mi_col + uVar13;
  goto LAB_001da160;
}

Assistant:

static inline void collect_mv_stats_sb(MV_STATS *mv_stats, const AV1_COMP *cpi,
                                       int mi_row, int mi_col,
                                       BLOCK_SIZE bsize) {
  assert(bsize < BLOCK_SIZES_ALL);
  const AV1_COMMON *cm = &cpi->common;

  if (mi_row >= cm->mi_params.mi_rows || mi_col >= cm->mi_params.mi_cols)
    return;

  const PARTITION_TYPE partition = get_partition(cm, mi_row, mi_col, bsize);
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);

  const int hbs = mi_size_wide[bsize] / 2;
  const int qbs = mi_size_wide[bsize] / 4;
  switch (partition) {
    case PARTITION_NONE:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      break;
    case PARTITION_HORZ:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col);
      break;
    case PARTITION_VERT:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col + hbs);
      break;
    case PARTITION_SPLIT:
      collect_mv_stats_sb(mv_stats, cpi, mi_row, mi_col, subsize);
      collect_mv_stats_sb(mv_stats, cpi, mi_row, mi_col + hbs, subsize);
      collect_mv_stats_sb(mv_stats, cpi, mi_row + hbs, mi_col, subsize);
      collect_mv_stats_sb(mv_stats, cpi, mi_row + hbs, mi_col + hbs, subsize);
      break;
    case PARTITION_HORZ_A:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col + hbs);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col);
      break;
    case PARTITION_HORZ_B:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col + hbs);
      break;
    case PARTITION_VERT_A:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col + hbs);
      break;
    case PARTITION_VERT_B:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col + hbs);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col + hbs);
      break;
    case PARTITION_HORZ_4:
      for (int i = 0; i < 4; ++i) {
        const int this_mi_row = mi_row + i * qbs;
        collect_mv_stats_b(mv_stats, cpi, this_mi_row, mi_col);
      }
      break;
    case PARTITION_VERT_4:
      for (int i = 0; i < 4; ++i) {
        const int this_mi_col = mi_col + i * qbs;
        collect_mv_stats_b(mv_stats, cpi, mi_row, this_mi_col);
      }
      break;
    default: assert(0);
  }
}